

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweep.h
# Opt level: O0

size_t __thiscall
Memory::RecyclerSweep::
GetHeapBlockCount<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
          (RecyclerSweep *this,
          HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
          *heapBucket)

{
  BucketData<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_> *pBVar1;
  size_t sVar2;
  size_t sVar3;
  BucketData<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_> *bucketData;
  HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_> *heapBucket_local
  ;
  RecyclerSweep *this_local;
  
  if ((heapBucket->super_HeapBucket).heapInfo == this->heapInfo) {
    pBVar1 = GetBucketData<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
                       (this,heapBucket);
    sVar2 = HeapBlockList::Count<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
                      (pBVar1->pendingSweepList);
    sVar3 = HeapBlockList::Count<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>
                      (pBVar1->pendingEmptyBlockList);
    this_local = (RecyclerSweep *)(sVar2 + sVar3);
  }
  else {
    this_local = (RecyclerSweep *)0x0;
  }
  return (size_t)this_local;
}

Assistant:

size_t
RecyclerSweep::GetHeapBlockCount(HeapBucketT<TBlockType> const * heapBucket)
{
    if (heapBucket->heapInfo != this->heapInfo)
    {
        return 0;
    }
    auto& bucketData = this->GetBucketData(heapBucket);
    return HeapBlockList::Count(bucketData.pendingSweepList)
        + HeapBlockList::Count(bucketData.pendingEmptyBlockList);
}